

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  float fVar1;
  double dVar2;
  float z_1;
  float z;
  stbi_uc *output;
  int n;
  int k;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint local_28;
  int local_24;
  int local_20;
  stbi_uc *local_8;
  
  if (in_RDI == (void *)0x0) {
    local_8 = (stbi_uc *)0x0;
  }
  else {
    local_8 = (stbi_uc *)
              stbi__malloc_mad3(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0,0x160bae);
    if (local_8 == (stbi_uc *)0x0) {
      free(in_RDI);
      stbi__err("outofmem");
      local_8 = (stbi_uc *)0x0;
    }
    else {
      local_28 = in_ECX;
      if ((in_ECX & 1) == 0) {
        local_28 = in_ECX - 1;
      }
      for (local_20 = 0; local_20 < in_ESI * in_EDX; local_20 = local_20 + 1) {
        for (local_24 = 0; local_24 < (int)local_28; local_24 = local_24 + 1) {
          dVar2 = pow((double)(*(float *)((long)in_RDI +
                                         (long)(int)(local_20 * in_ECX + local_24) * 4) *
                              stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
          fVar1 = (float)dVar2 * 255.0 + 0.5;
          if (fVar1 < 0.0) {
            fVar1 = 0.0;
          }
          if (255.0 < fVar1) {
            fVar1 = 255.0;
          }
          local_8[(int)(local_20 * in_ECX + local_24)] = (stbi_uc)(int)fVar1;
        }
        if (local_24 < (int)in_ECX) {
          fVar1 = *(float *)((long)in_RDI + (long)(int)(local_20 * in_ECX + local_24) * 4) * 255.0 +
                  0.5;
          if (fVar1 < 0.0) {
            fVar1 = 0.0;
          }
          if (255.0 < fVar1) {
            fVar1 = 255.0;
          }
          local_8[(int)(local_20 * in_ECX + local_24)] = (stbi_uc)(int)fVar1;
        }
      }
      free(in_RDI);
    }
  }
  return local_8;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}